

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::ServiceDescriptorProto::Clear(ServiceDescriptorProto *this)

{
  ServiceOptions *this_00;
  anon_union_48_1_493b367e_for_ServiceDescriptorProto_4 aVar1;
  undefined8 *puVar2;
  LogMessageFatal aLStack_18 [16];
  
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
            (&(this->field_0)._impl_.method_.super_RepeatedPtrFieldBase);
  aVar1 = this->field_0;
  if (((undefined1  [48])aVar1 & (undefined1  [48])0x3) != (undefined1  [48])0x0) {
    if (((undefined1  [48])aVar1 & (undefined1  [48])0x1) != (undefined1  [48])0x0) {
      puVar2 = (undefined8 *)
               ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    }
    if (((undefined1  [48])aVar1 & (undefined1  [48])0x2) != (undefined1  [48])0x0) {
      this_00 = (this->field_0)._impl_.options_;
      if (this_00 == (ServiceOptions *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (aLStack_18,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor.pb.cc"
                   ,0x1d6b,0x1a,"_impl_.options_ != nullptr");
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
      }
      ServiceOptions::Clear(this_00);
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void ServiceDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.ServiceDescriptorProto)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.method_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _impl_.name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      ABSL_DCHECK(_impl_.options_ != nullptr);
      _impl_.options_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}